

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.h
# Opt level: O0

void __thiscall
gui::Signal<gui::Gui_*,_sf::RenderWindow_&,_const_sf::Vector2<unsigned_int>_&>::emit
          (Signal<gui::Gui_*,_sf::RenderWindow_&,_const_sf::Vector2<unsigned_int>_&> *this,
          Gui *funcArgs,RenderWindow *funcArgs_1,Vector2<unsigned_int> *funcArgs_2)

{
  bool bVar1;
  Tag TVar2;
  const_iterator this_00;
  const_iterator __args;
  Vector2<unsigned_int> *in_RDI;
  pair<const_unsigned_int,_gui::Callback<gui::Gui_*,_sf::RenderWindow_&,_const_sf::Vector2<unsigned_int>_&>_>
  *c;
  const_iterator __end0;
  const_iterator __begin0;
  map<unsigned_int,_gui::Callback<gui::Gui_*,_sf::RenderWindow_&,_const_sf::Vector2<unsigned_int>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Gui_*,_sf::RenderWindow_&,_const_sf::Vector2<unsigned_int>_&>_>_>_>
  *__range2;
  RenderWindow *in_stack_ffffffffffffffc0;
  
  if ((undefined1  [48])
      ((undefined1  [48])((_Rep_type *)&in_RDI->x)->_M_impl & (undefined1  [48])0x1) !=
      (undefined1  [48])0x0) {
    this_00 = std::
              map<unsigned_int,_gui::Callback<gui::Gui_*,_sf::RenderWindow_&,_const_sf::Vector2<unsigned_int>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Gui_*,_sf::RenderWindow_&,_const_sf::Vector2<unsigned_int>_&>_>_>_>
              ::begin((map<unsigned_int,_gui::Callback<gui::Gui_*,_sf::RenderWindow_&,_const_sf::Vector2<unsigned_int>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Gui_*,_sf::RenderWindow_&,_const_sf::Vector2<unsigned_int>_&>_>_>_>
                       *)in_RDI);
    __args = std::
             map<unsigned_int,_gui::Callback<gui::Gui_*,_sf::RenderWindow_&,_const_sf::Vector2<unsigned_int>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Gui_*,_sf::RenderWindow_&,_const_sf::Vector2<unsigned_int>_&>_>_>_>
             ::end((map<unsigned_int,_gui::Callback<gui::Gui_*,_sf::RenderWindow_&,_const_sf::Vector2<unsigned_int>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Gui_*,_sf::RenderWindow_&,_const_sf::Vector2<unsigned_int>_&>_>_>_>
                    *)in_RDI);
    while (bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffd0,
                                   (_Self *)&stack0xffffffffffffffc8), bVar1) {
      in_stack_ffffffffffffffc0 =
           (RenderWindow *)
           std::
           _Rb_tree_const_iterator<std::pair<const_unsigned_int,_gui::Callback<gui::Gui_*,_sf::RenderWindow_&,_const_sf::Vector2<unsigned_int>_&>_>_>
           ::operator*((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_gui::Callback<gui::Gui_*,_sf::RenderWindow_&,_const_sf::Vector2<unsigned_int>_&>_>_>
                        *)in_stack_ffffffffffffffc0);
      TVar2 = Callback<gui::Gui_*,_sf::RenderWindow_&,_const_sf::Vector2<unsigned_int>_&>::getTag
                        ((Callback<gui::Gui_*,_sf::RenderWindow_&,_const_sf::Vector2<unsigned_int>_&>
                          *)&(in_stack_ffffffffffffffc0->super_Window).super_WindowBase.m_impl);
      if (TVar2 == withArgs) {
        Callback<gui::Gui*,sf::RenderWindow&,sf::Vector2<unsigned_int>const&>::
        value<(gui::Callback<gui::Gui*,sf::RenderWindow&,sf::Vector2<unsigned_int>const&>::Tag)0,void>
                  ((Callback<gui::Gui*,sf::RenderWindow&,sf::Vector2<unsigned_int>const&> *)
                   &(in_stack_ffffffffffffffc0->super_Window).super_WindowBase.m_impl);
        std::function<void_(gui::Gui_*,_sf::RenderWindow_&,_const_sf::Vector2<unsigned_int>_&)>::
        operator()((function<void_(gui::Gui_*,_sf::RenderWindow_&,_const_sf::Vector2<unsigned_int>_&)>
                    *)this_00._M_node,(Gui *)__args._M_node,in_stack_ffffffffffffffc0,in_RDI);
      }
      else {
        Callback<gui::Gui*,sf::RenderWindow&,sf::Vector2<unsigned_int>const&>::
        value<(gui::Callback<gui::Gui*,sf::RenderWindow&,sf::Vector2<unsigned_int>const&>::Tag)1,void>
                  ((Callback<gui::Gui*,sf::RenderWindow&,sf::Vector2<unsigned_int>const&> *)
                   &(in_stack_ffffffffffffffc0->super_Window).super_WindowBase.m_impl);
        std::function<void_()>::operator()((function<void_()> *)in_stack_ffffffffffffffc0);
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_int,_gui::Callback<gui::Gui_*,_sf::RenderWindow_&,_const_sf::Vector2<unsigned_int>_&>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_gui::Callback<gui::Gui_*,_sf::RenderWindow_&,_const_sf::Vector2<unsigned_int>_&>_>_>
                    *)in_stack_ffffffffffffffc0);
    }
  }
  return;
}

Assistant:

void emit(Targs... funcArgs) const {
        if (!enabled_) {
            return;
        }
        using Tag = typename Callback<Targs...>::Tag;
        for (const auto& c : callbacks_) {
            if (c.second.getTag() == Tag::withArgs) {
                c.second.template value<Tag::withArgs>()(funcArgs...);
            } else {
                c.second.template value<Tag::noArgs>()();
            }
        }
    }